

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

_Bool rtosc_valid_message_p(char *msg,size_t len)

{
  ushort **ppuVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  _Bool _Var8;
  ring_t local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (*msg != '/') {
    return false;
  }
  pcVar2 = msg;
  if (len != 0) {
    ppuVar1 = __ctype_b_loc();
    cVar5 = '/';
    uVar6 = 1;
    do {
      uVar7 = uVar6;
      if ((*(byte *)((long)*ppuVar1 + (long)cVar5 * 2 + 1) & 0x40) == 0) goto LAB_001030c0;
      if (len <= (uVar7 & 0xffffffff)) break;
      cVar5 = msg[uVar7];
      uVar6 = uVar7 + 1;
    } while (cVar5 != '\0');
    pcVar2 = msg + uVar7;
  }
  uVar4 = (long)pcVar2 - (long)msg;
  uVar6 = uVar4;
  uVar7 = uVar4;
  for (; (uVar6 < len && (uVar7 = uVar6, *pcVar2 != ',')); pcVar2 = pcVar2 + 1) {
    uVar6 = uVar6 + 1;
    uVar7 = len;
  }
  if ((uVar7 & 3) == 0 && uVar7 - uVar4 < 5) {
    local_28 = 0;
    uStack_20 = 0;
    local_38.data = msg;
    local_38.len = len;
    sVar3 = rtosc_message_ring_length(&local_38);
    _Var8 = sVar3 == len;
  }
  else {
LAB_001030c0:
    _Var8 = false;
  }
  return _Var8;
}

Assistant:

bool rtosc_valid_message_p(const char *msg, size_t len)
{
    //Validate Path Characters (assumes printable characters are sufficient)
    if(*msg != '/')
        return false;
    const char *tmp = msg;
    for(unsigned i=0; i<len; ++i) {
        if(*tmp == 0)
            break;
        if(!isprint(*tmp))
            return false;
        tmp++;
    }

    //tmp is now either pointing to a null or the end of the string
    const size_t offset1 = tmp-msg;
    size_t       offset2 = tmp-msg;
    for(; offset2<len; offset2++) {
        if(*tmp == ',')
            break;
        tmp++;
    }

    //Too many NULL bytes
    if(offset2-offset1 > 4)
        return false;

    if((offset2 % 4) != 0)
        return false;

    size_t observed_length = rtosc_message_length(msg, len);
    return observed_length == len;
}